

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::DictionaryTypeHandlerBase<int>::SetPropertyValueInfo
          (DictionaryTypeHandlerBase<int> *this,PropertyValueInfo *info,RecyclableObject *instance,
          int propIndex,DictionaryPropertyDescriptor<int> *descriptor)

{
  bool bVar1;
  DictionaryPropertyDescriptor<int> *descriptor_local;
  int propIndex_local;
  RecyclableObject *instance_local;
  PropertyValueInfo *info_local;
  DictionaryTypeHandlerBase<int> *this_local;
  
  SetPropertyValueInfoNonFixed
            (this,info,instance,propIndex,descriptor->Attributes,InlineCacheNoFlags);
  bVar1 = DictionaryPropertyDescriptor<int>::IsOrMayBecomeFixed(descriptor);
  if (bVar1) {
    PropertyValueInfo::DisableStoreFieldCache(info);
  }
  if ((descriptor->Attributes & 8) != 0) {
    PropertyValueInfo::SetNoCache(info,instance);
  }
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::SetPropertyValueInfo(PropertyValueInfo* info, RecyclableObject* instance, T propIndex, DictionaryPropertyDescriptor<T>* descriptor)
    {
        SetPropertyValueInfoNonFixed(info, instance, propIndex, descriptor->Attributes);
        if (descriptor->IsOrMayBecomeFixed())
        {
            PropertyValueInfo::DisableStoreFieldCache(info);
        }
        if (descriptor->Attributes & PropertyDeleted)
        {
            // letconst shadowing a deleted property. don't bother to cache
            PropertyValueInfo::SetNoCache(info, instance);
        }
    }